

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O0

int AF_A_FAxeAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  player_t *player_00;
  AWeapon *this_01;
  APlayerPawn *pAVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  AAmmo *pAVar5;
  FState *pFVar6;
  bool bVar7;
  bool local_132;
  bool local_12f;
  FName local_12c;
  AWeapon *local_128;
  AWeapon *weapon_1;
  TAngle<double> local_118;
  TAngle<double> local_110;
  TAngle<double> local_108;
  undefined1 local_100 [16];
  TAngle<double> local_f0;
  TFlags<ActorFlag3,_unsigned_int> local_e8;
  FName local_e4;
  TAngle<double> local_e0;
  TAngle<double> local_d8;
  TAngle<double> local_d0;
  undefined1 local_c8 [16];
  TAngle<double> local_b8;
  int local_ac;
  APlayerPawn *pAStack_a8;
  int j;
  AActor *pmo;
  FTranslatedLineTarget t;
  PClassActor *pufftype;
  AWeapon *weapon;
  player_t *player;
  int useMana;
  int i;
  DAngle slope;
  int damage;
  int power;
  DAngle angle;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                  ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar7 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar7 = true, (param->field_0).field_1.atag != 1)) {
    bVar7 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar7) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                  ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_12f = true;
  if (this != (DObject *)0x0) {
    local_12f = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_12f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                  ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar7 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar7 = true, param[1].field_0.field_1.atag != 1)) {
      bVar7 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar7) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                    ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_132 = true;
    if (this_00 != (DObject *)0x0) {
      local_132 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_132 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                    ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    angle.Degrees = 0.0;
  }
  else {
    bVar7 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar7 = true, param[2].field_0.field_1.atag != 8)) {
      bVar7 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar7) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                    ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    angle.Degrees = (double)param[2].field_0.field_1.a;
  }
  TAngle<double>::TAngle((TAngle<double> *)&damage);
  TAngle<double>::TAngle((TAngle<double> *)&useMana);
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&pmo);
  player_00 = *(player_t **)&this[0xc].ObjectFlags;
  if (player_00 != (player_t *)0x0) {
    pAStack_a8 = player_00->mo;
    uVar4 = FRandom::operator()(&pr_axeatk);
    slope.Degrees._0_4_ = (uVar4 & 0xf) + 0x28;
    uVar4 = FRandom::operator()(&pr_axeatk);
    slope.Degrees._0_4_ = (uVar4 & 7) + slope.Degrees._0_4_;
    slope.Degrees._4_4_ = 0;
    pAVar5 = TObjPtr<AAmmo>::operator->(&player_00->ReadyWeapon->Ammo1);
    bVar7 = (pAVar5->super_AInventory).Amount < 1;
    if (bVar7) {
      t._16_8_ = PClass::FindActor("AxePuff");
    }
    else {
      slope.Degrees._0_4_ = slope.Degrees._0_4_ << 1;
      slope.Degrees._4_4_ = 6;
      t._16_8_ = PClass::FindActor("AxePuffGlow");
    }
    cVar3 = !bVar7;
    for (player._4_4_ = 0; player._4_4_ < 0x10; player._4_4_ = player._4_4_ + 1) {
      for (local_ac = 1; -2 < local_ac; local_ac = local_ac + -2) {
        TAngle<double>::operator+(&local_b8,(double)(local_ac * player._4_4_) * 2.8125);
        TAngle<double>::operator=((TAngle<double> *)&damage,&local_b8);
        pAVar1 = pAStack_a8;
        TAngle<double>::TAngle((TAngle<double> *)local_c8,(TAngle<double> *)&damage);
        TAngle<double>::TAngle(&local_d0,0.0);
        P_AimLineAttack((AActor *)(local_c8 + 8),(DAngle *)pAVar1,144.0,
                        (FTranslatedLineTarget *)local_c8,(DAngle *)&pmo,(int)&local_d0,
                        (AActor *)0x0,(AActor *)0x0);
        TAngle<double>::operator=((TAngle<double> *)&useMana,(TAngle<double> *)(local_c8 + 8));
        pAVar1 = pAStack_a8;
        if (pmo != (AActor *)0x0) {
          TAngle<double>::TAngle(&local_d8,(TAngle<double> *)&damage);
          TAngle<double>::TAngle(&local_e0,(TAngle<double> *)&useMana);
          iVar2 = slope.Degrees._0_4_;
          FName::FName(&local_e4,NAME_Melee);
          P_LineAttack(&pAVar1->super_AActor,&local_d8,144.0,&local_e0,iVar2,&local_e4,
                       (PClassActor *)t._16_8_,1,(FTranslatedLineTarget *)&pmo,(int *)0x0);
          if (pmo != (AActor *)0x0) {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_e8,
                       (int)pmo + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG))
            ;
            uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e8);
            bVar7 = true;
            if (uVar4 == 0) {
              bVar7 = pmo->player != (player_t *)0x0;
            }
            if (bVar7) {
              TAngle<double>::TAngle(&local_f0,(TAngle<double> *)&t);
              AActor::Thrust(pmo,&local_f0,(double)slope.Degrees._4_4_);
            }
            AdjustPlayerAngle(&pAStack_a8->super_AActor,(FTranslatedLineTarget *)&pmo);
            cVar3 = cVar3 + '\x01';
            goto LAB_0078ce0d;
          }
        }
      }
    }
    (pAStack_a8->super_AActor).weaponspecial = 0;
    TAngle<double>::operator=((TAngle<double> *)&damage,&(pAStack_a8->super_AActor).Angles.Yaw);
    pAVar1 = pAStack_a8;
    TAngle<double>::TAngle((TAngle<double> *)local_100,(TAngle<double> *)&damage);
    TAngle<double>::TAngle(&local_108,0.0);
    P_AimLineAttack((AActor *)(local_100 + 8),(DAngle *)pAVar1,64.0,
                    (FTranslatedLineTarget *)local_100,(DAngle *)0x0,(int)&local_108,(AActor *)0x0,
                    (AActor *)0x0);
    TAngle<double>::operator=((TAngle<double> *)&useMana,(TAngle<double> *)(local_100 + 8));
    pAVar1 = pAStack_a8;
    TAngle<double>::TAngle(&local_110,(TAngle<double> *)&damage);
    TAngle<double>::TAngle(&local_118,(TAngle<double> *)&useMana);
    iVar2 = slope.Degrees._0_4_;
    FName::FName((FName *)((long)&weapon_1 + 4),NAME_Melee);
    P_LineAttack(&pAVar1->super_AActor,&local_110,64.0,&local_118,iVar2,
                 (FName *)((long)&weapon_1 + 4),(PClassActor *)t._16_8_,1,
                 (FTranslatedLineTarget *)0x0,(int *)0x0);
LAB_0078ce0d:
    if ((cVar3 == '\x02') && (local_128 = player_00->ReadyWeapon, local_128 != (AWeapon *)0x0)) {
      AWeapon::DepleteAmmo(local_128,(bool)(local_128->bAltFire & 1),false,-1);
      bVar7 = TObjPtr<AAmmo>::operator==(&local_128->Ammo1,(AAmmo *)0x0);
      if (((bVar7) ||
          (pAVar5 = TObjPtr<AAmmo>::operator->(&local_128->Ammo1),
          (pAVar5->super_AInventory).Amount == 0)) &&
         ((((*(uint *)&(local_128->super_AInventory).field_0x4dc & 0x80) == 0 ||
           (bVar7 = TObjPtr<AAmmo>::operator==(&local_128->Ammo2,(AAmmo *)0x0), bVar7)) ||
          (pAVar5 = TObjPtr<AAmmo>::operator->(&local_128->Ammo2),
          (pAVar5->super_AInventory).Amount == 0)))) {
        this_01 = player_00->ReadyWeapon;
        FName::FName(&local_12c,"Fire");
        pFVar6 = AActor::FindState((AActor *)this_01,&local_12c);
        P_SetPsprite(player_00,PSP_WEAPON,pFVar6 + 5,false);
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeAttack)
{
	PARAM_ACTION_PROLOGUE;

	DAngle angle;
	int power;
	int damage;
	DAngle slope;
	int i;
	int useMana;
	player_t *player;
	AWeapon *weapon;
	PClassActor *pufftype;
	FTranslatedLineTarget t;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	AActor *pmo=player->mo;

	damage = 40+(pr_axeatk()&15);
	damage += pr_axeatk()&7;
	power = 0;
	weapon = player->ReadyWeapon;
	if (player->ReadyWeapon->Ammo1->Amount > 0)
	{
		damage <<= 1;
		power = 6;
		pufftype = PClass::FindActor ("AxePuffGlow");
		useMana = 1;
	}
	else
	{
		pufftype = PClass::FindActor ("AxePuff");
		useMana = 0;
	}
	for (i = 0; i < 16; i++)
	{
		for (int j = 1; j >= -1; j -= 2)
		{
			angle = pmo->Angles.Yaw + j*i*(45. / 16);
			slope = P_AimLineAttack(pmo, angle, AXERANGE, &t);
			if (t.linetarget)
			{
				P_LineAttack(pmo, angle, AXERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
				if (t.linetarget != nullptr)
				{
					if (t.linetarget->flags3&MF3_ISMONSTER || t.linetarget->player)
					{
						t.linetarget->Thrust(t.angleFromSource, power);
					}
					AdjustPlayerAngle(pmo, &t);
					useMana++;
					goto axedone;
				}
			}
		}
	}
	// didn't find any creatures, so try to strike any walls
	pmo->weaponspecial = 0;

	angle = pmo->Angles.Yaw;
	slope = P_AimLineAttack (pmo, angle, MELEERANGE);
	P_LineAttack (pmo, angle, MELEERANGE, slope, damage, NAME_Melee, pufftype, true);

axedone:
	if (useMana == 2)
	{
		AWeapon *weapon = player->ReadyWeapon;
		if (weapon != nullptr)
		{
			weapon->DepleteAmmo (weapon->bAltFire, false);

			if ((weapon->Ammo1 == nullptr || weapon->Ammo1->Amount == 0) &&
				(!(weapon->WeaponFlags & WIF_PRIMARY_USES_BOTH) ||
				  weapon->Ammo2 == nullptr || weapon->Ammo2->Amount == 0))
			{
				P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Fire") + 5);
			}
		}
	}
	return 0;		
}